

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O0

void sigmund_getrawpeaks(int npts,t_float *insamps,int npeak,t_peak_conflict *peakv,int *nfound,
                        t_float *power,t_float srate,int loud,t_float hifreq)

{
  t_sample *ptVar1;
  int bestindex_00;
  t_float maxpower_00;
  t_float *ptVar2;
  t_float *ptVar3;
  t_float *ftreal;
  t_float npeak_00;
  int iVar4;
  int *piVar5;
  int iVar6;
  t_sample *ptVar7;
  t_sample *ptVar8;
  t_sample *ptVar9;
  size_t nbytes;
  float fVar10;
  float fVar11;
  float fVar12;
  t_float tVar13;
  double dVar14;
  t_sample tStack_108;
  undefined1 local_101;
  double local_100;
  t_sample *local_f8;
  float local_ec;
  int local_e8;
  t_float thresh;
  int bestindex;
  t_float powmask;
  t_float freqout;
  t_float ampoutimag;
  t_float ampoutreal;
  t_float ampout;
  t_float ampcorrect;
  t_float cospidetune;
  t_float sinpidetune;
  t_float pidetune;
  t_float detune;
  t_float windpower;
  t_float windimag;
  t_float windreal;
  t_float maxpower;
  t_float pow1;
  t_float p;
  t_float x2;
  t_float x1;
  int maxbin;
  t_float *bigbuf;
  t_float *powbuf;
  t_float *maskbuf;
  t_float *rawimag;
  t_float *rawreal;
  t_float *fp2;
  t_float *fp1;
  int peakcount;
  int bufsize;
  int bin;
  int i;
  int npts2;
  t_float totalpower;
  t_float fperbin;
  t_float oneovern;
  t_float hifreq_local;
  t_float srate_local;
  t_float *power_local;
  int *nfound_local;
  t_peak_conflict *peakv_local;
  t_float *ptStack_18;
  int npeak_local;
  t_float *insamps_local;
  int npts_local;
  
  ptVar9 = &tStack_108;
  totalpower = 1.0 / (float)npts;
  npts2 = (int)(srate * 0.5 * totalpower);
  i = 0;
  bin = npts << 1;
  fp1._4_4_ = (npts * 6 + 8) * 4;
  fp1._0_4_ = 0.0;
  fperbin = hifreq;
  oneovern = srate;
  _hifreq_local = power;
  power_local = (t_float *)nfound;
  nfound_local = (int *)peakv;
  peakv_local._4_4_ = npeak;
  ptStack_18 = insamps;
  insamps_local._4_4_ = npts;
  if (fp1._4_4_ < 400000) {
    ptVar9 = (t_sample *)((long)&tStack_108 - ((long)fp1._4_4_ + 0xfU & 0xfffffffffffffff0));
    local_f8 = ptVar9;
  }
  else {
    local_f8 = (t_sample *)getbytes((long)fp1._4_4_);
  }
  iVar4 = bin;
  ptVar1 = local_f8;
  _x1 = local_f8;
  x2 = (t_float)(int)(fperbin / (float)npts2);
  if (insamps_local._4_4_ + -4 < (int)x2) {
    x2 = (t_float)(insamps_local._4_4_ + -4);
  }
  ptVar7 = local_f8 + bin;
  ptVar8 = ptVar7 + insamps_local._4_4_;
  for (bufsize = 0; bufsize < insamps_local._4_4_; bufsize = bufsize + 1) {
    ptVar7[bufsize] = 0.0;
  }
  for (bufsize = 0; bufsize < insamps_local._4_4_; bufsize = bufsize + 1) {
    local_f8[bufsize] = ptStack_18[bufsize];
  }
  for (bufsize = insamps_local._4_4_;
      SBORROW4(bufsize,insamps_local._4_4_ * 2) != bufsize + insamps_local._4_4_ * -2 < 0;
      bufsize = bufsize + 1) {
    local_f8[bufsize] = 0.0;
  }
  bigbuf = ptVar8;
  powbuf = ptVar7;
  maskbuf = ptVar8 + (long)insamps_local._4_4_ + 4 + (long)insamps_local._4_4_ + 4;
  rawimag = ptVar8 + (long)insamps_local._4_4_ + 4;
  ptVar9[-2] = 2.966313e-39;
  ptVar9[-1] = 0.0;
  mayer_realfft(iVar4,ptVar1);
  for (bufsize = 0; bufsize < insamps_local._4_4_; bufsize = bufsize + 1) {
    rawimag[bufsize] = _x1[bufsize];
  }
  for (bufsize = 1; bufsize < insamps_local._4_4_ + -1; bufsize = bufsize + 1) {
    maskbuf[bufsize] = _x1[bin - bufsize];
  }
  rawimag[-1] = rawimag[1];
  rawimag[-2] = rawimag[2];
  rawimag[-3] = rawimag[3];
  rawimag[-4] = rawimag[4];
  maskbuf[insamps_local._4_4_ + -1] = 0.0;
  *maskbuf = 0.0;
  maskbuf[-1] = -maskbuf[1];
  maskbuf[-2] = -maskbuf[2];
  maskbuf[-3] = -maskbuf[3];
  maskbuf[-4] = -maskbuf[4];
  fp2 = rawimag;
  rawreal = maskbuf;
  for (bufsize = 0; bufsize < (int)x2; bufsize = bufsize + 1) {
    fVar10 = fp2[1] - fp2[-1];
    fVar11 = rawreal[1] - rawreal[-1];
    fVar12 = fVar10 * fVar10 + fVar11 * fVar11;
    bigbuf[bufsize] = fVar12;
    if (1 < bufsize) {
      i = (int)(fVar12 + (float)i);
    }
    fp2 = fp2 + 1;
    rawreal = rawreal + 1;
    maxpower = fVar12;
    pow1 = fVar11;
    p = fVar10;
  }
  bigbuf[(int)x2 + 1] = 0.0;
  bigbuf[(int)x2] = 0.0;
  *_hifreq_local = (float)i * 0.5 * totalpower * totalpower;
  for (fp1._0_4_ = 0.0; iVar6 = insamps_local._4_4_, piVar5 = nfound_local, iVar4 = npts2,
      npeak_00 = fp1._0_4_, ftreal = rawimag, ptVar3 = maskbuf, ptVar2 = powbuf, tVar13 = x2,
      (int)fp1._0_4_ < peakv_local._4_4_; fp1._0_4_ = (t_float)((int)fp1._0_4_ + 1)) {
    windimag = 0.0;
    local_e8 = -1;
    fp2 = rawimag + 2;
    rawreal = maskbuf + 2;
    for (peakcount = 2; maxpower_00 = windimag, bestindex_00 = local_e8, peakcount < (int)x2;
        peakcount = peakcount + 1) {
      windreal = bigbuf[peakcount];
      if (((windimag < windreal) && (powbuf[peakcount] <= windreal && windreal != powbuf[peakcount])
          ) && (local_ec = (bigbuf[peakcount + -2] + bigbuf[peakcount + 2]) * 0.6,
               local_ec < windreal)) {
        local_e8 = peakcount;
        windimag = windreal;
      }
      fp2 = fp2 + 1;
      rawreal = rawreal + 1;
    }
    if ((((float)i <= 0.0) || (windimag < (float)i * 1e-10)) || (local_e8 < 0)) break;
    fp2 = rawimag + local_e8;
    rawreal = maskbuf + local_e8;
    fVar10 = windimag * 1.0;
    thresh = fVar10;
    ptVar9[-2] = 2.967939e-39;
    ptVar9[-1] = 0.0;
    sigmund_remask((int)tVar13,bestindex_00,fVar10,maxpower_00,ptVar2);
    windpower = fp2[1] - fp2[-1];
    detune = rawreal[1] - rawreal[-1];
    pidetune = windpower * windpower + detune * detune;
    sinpidetune = (fp2[1] * fp2[1] + -(fp2[-1] * fp2[-1]) +
                  rawreal[1] * rawreal[1] + -(rawreal[-1] * rawreal[-1])) / (pidetune * 2.0);
    if (sinpidetune <= 0.5) {
      if (sinpidetune < -0.5) {
        sinpidetune = -0.5;
      }
    }
    else {
      sinpidetune = 0.5;
    }
    cospidetune = sinpidetune * 3.1415927;
    dVar14 = (double)cospidetune;
    ptVar9[-2] = 2.968481e-39;
    ptVar9[-1] = 0.0;
    dVar14 = sin(dVar14);
    ampcorrect = (t_float)dVar14;
    dVar14 = (double)cospidetune;
    ptVar9[-2] = 2.968522e-39;
    ptVar9[-1] = 0.0;
    dVar14 = cos(dVar14);
    tVar13 = cospidetune;
    ampout = (float)dVar14;
    ptVar9[-2] = 2.968568e-39;
    ptVar9[-1] = 0.0;
    tVar13 = window_mag(tVar13,(float)dVar14);
    ampoutreal = 1.0 / tVar13;
    local_100 = (double)ampoutreal;
    dVar14 = (double)pidetune;
    ptVar9[-2] = 2.968659e-39;
    ptVar9[-1] = 0.0;
    dVar14 = sqrt(dVar14);
    ampoutimag = (t_float)(local_100 * dVar14);
    freqout = ampoutreal * (windpower * ampout + -(detune * ampcorrect));
    powmask = ampoutreal * (windpower * ampcorrect + detune * ampout);
    bestindex = (int)(sinpidetune + sinpidetune + (float)local_e8);
    nfound_local[(long)(int)fp1._0_4_ * 8] = (int)((float)bestindex * (float)npts2);
    nfound_local[(long)(int)fp1._0_4_ * 8 + 1] = (int)(totalpower * ampoutimag);
    nfound_local[(long)(int)fp1._0_4_ * 8 + 2] = (int)(totalpower * freqout);
    nfound_local[(long)(int)fp1._0_4_ * 8 + 3] = (int)(totalpower * powmask);
  }
  ptVar9[-2] = 2.969165e-39;
  ptVar9[-1] = 0.0;
  sigmund_tweak(iVar6,ftreal,ptVar3,(int)npeak_00,(t_peak_conflict *)piVar5,(t_float)iVar4,loud);
  iVar6 = insamps_local._4_4_;
  piVar5 = nfound_local;
  iVar4 = npts2;
  tVar13 = fp1._0_4_;
  ptVar3 = rawimag;
  ptVar2 = maskbuf;
  ptVar9[-2] = 2.96921e-39;
  ptVar9[-1] = 0.0;
  sigmund_tweak(iVar6,ptVar3,ptVar2,(int)tVar13,(t_peak_conflict *)piVar5,(t_float)iVar4,loud);
  for (bufsize = 0; ptVar1 = _x1, bufsize < (int)fp1._0_4_; bufsize = bufsize + 1) {
    tVar13 = (t_float)nfound_local[(long)bufsize * 8];
    ptVar9[-2] = 2.969265e-39;
    ptVar9[-1] = 0.0;
    tVar13 = sigmund_ftom(tVar13);
    nfound_local[(long)bufsize * 8 + 4] = (int)tVar13;
    tVar13 = (t_float)nfound_local[(long)bufsize * 8 + 1];
    ptVar9[-2] = 2.969328e-39;
    ptVar9[-1] = 0.0;
    tVar13 = sigmund_powtodb(tVar13);
    nfound_local[(long)bufsize * 8 + 5] = (int)tVar13;
  }
  *power_local = fp1._0_4_;
  local_101 = 1;
  if (399999 < fp1._4_4_) {
    nbytes = (size_t)fp1._4_4_;
    ptVar9[-2] = 2.96943e-39;
    ptVar9[-1] = 0.0;
    freebytes(ptVar1,nbytes);
  }
  return;
}

Assistant:

static void sigmund_getrawpeaks(int npts, t_float *insamps,
    int npeak, t_peak *peakv, int *nfound, t_float *power, t_float srate,
    int loud, t_float hifreq)
{
    t_float oneovern = 1.0/ (t_float)npts;
    t_float fperbin = 0.5 * srate * oneovern, totalpower = 0;
    int npts2 = 2*npts, i, bin, bufsize = sizeof (t_float ) *
        (2*NEGBINS + 6*npts);
    int peakcount = 0;
    t_float *fp1, *fp2;
    t_float *rawreal, *rawimag, *maskbuf, *powbuf;
    t_float *bigbuf = (t_float *)BUF_ALLOCA(bufsize);
    int maxbin = hifreq/fperbin;
    if (maxbin > npts - NEGBINS)
        maxbin = npts - NEGBINS;
    /* if (loud) post("tweak %d", tweak); */
    maskbuf = bigbuf + npts2;
    powbuf = maskbuf + npts;
    rawreal = powbuf + npts+NEGBINS;
    rawimag = rawreal+npts+NEGBINS;
    for (i = 0; i < npts; i++)
        maskbuf[i] = 0;

    for (i = 0; i < npts; i++)
        bigbuf[i] = insamps[i];
    for (i = npts; i < 2*npts; i++)
        bigbuf[i] = 0;
    mayer_realfft(npts2, bigbuf);
    for (i = 0; i < npts; i++)
        rawreal[i] = bigbuf[i];
    for (i = 1; i < npts-1; i++)
        rawimag[i] = bigbuf[npts2-i];
    rawreal[-1] = rawreal[1];
    rawreal[-2] = rawreal[2];
    rawreal[-3] = rawreal[3];
    rawreal[-4] = rawreal[4];
    rawimag[0] = rawimag[npts-1] = 0;
    rawimag[-1] = -rawimag[1];
    rawimag[-2] = -rawimag[2];
    rawimag[-3] = -rawimag[3];
    rawimag[-4] = -rawimag[4];
#if 1
    for (i = 0, fp1 = rawreal, fp2 = rawimag; i < maxbin; i++, fp1++, fp2++)
    {
        t_float x1 = fp1[1] - fp1[-1], x2 = fp2[1] - fp2[-1],
            p = powbuf[i] = x1*x1+x2*x2;
        if (i >= 2)
           totalpower += p;
    }
    powbuf[maxbin] = powbuf[maxbin+1] = 0;
    *power = 0.5 * totalpower *oneovern * oneovern;
#endif
    for (peakcount = 0; peakcount < npeak; peakcount++)
    {
        t_float pow1, maxpower = 0, windreal, windimag, windpower,
            detune, pidetune, sinpidetune, cospidetune, ampcorrect, ampout,
            ampoutreal, ampoutimag, freqout, powmask;
        int bestindex = -1;

        for (bin = 2, fp1 = rawreal+2, fp2 = rawimag+2;
            bin < maxbin; bin++, fp1++, fp2++)
        {
            pow1 = powbuf[bin];
            if (pow1 > maxpower && pow1 > maskbuf[bin])
            {
                t_float thresh = PEAKTHRESHFACTOR *
                    (powbuf[bin-2]+powbuf[bin+2]);
                if (pow1 > thresh)
                    maxpower = pow1, bestindex = bin;
            }
        }

        if (totalpower <= 0 || maxpower < 1e-10*totalpower || bestindex < 0)
            break;
        fp1 = rawreal+bestindex;
        fp2 = rawimag+bestindex;
        powmask = maxpower * PEAKMASKFACTOR;
        /* if (loud > 2)
            post("maxpower %f, powmask %f, param1 %f",
                maxpower, powmask, param1); */
        sigmund_remask(maxbin, bestindex, powmask, maxpower, maskbuf);
        
        /* if (loud > 1)
            post("best index %d, total power %f", bestindex, totalpower); */

        windreal = fp1[1] - fp1[-1];
        windimag = fp2[1] - fp2[-1];
        windpower = windreal * windreal + windimag * windimag;
        detune = ((fp1[1] * fp1[1] - fp1[-1]*fp1[-1]) 
            + (fp2[1] * fp2[1] - fp2[-1]*fp2[-1])) / (2 * windpower);

        if (detune > 0.5)
            detune = 0.5;
        else if (detune < -0.5)
            detune = -0.5;
        /* if (loud > 1)
            post("windpower %f, index %d, detune %f",
                windpower, bestindex, detune); */
        pidetune = PI * detune;
        sinpidetune = sin(pidetune);
        cospidetune = cos(pidetune);
        ampcorrect = 1.0 / window_mag(pidetune, cospidetune);

        ampout = ampcorrect *sqrt(windpower);
        ampoutreal = ampcorrect *
            (windreal * cospidetune - windimag * sinpidetune);
        ampoutimag = ampcorrect *
            (windreal * sinpidetune + windimag * cospidetune);

            /* the frequency is the sum of the bin frequency and detuning */

        peakv[peakcount].p_freq = (freqout = (bestindex + 2*detune)) * fperbin;
        peakv[peakcount].p_amp = oneovern * ampout;
        peakv[peakcount].p_ampreal = oneovern * ampoutreal;
        peakv[peakcount].p_ampimag = oneovern * ampoutimag;
    }
    sigmund_tweak(npts, rawreal, rawimag, peakcount, peakv, fperbin, loud);
    sigmund_tweak(npts, rawreal, rawimag, peakcount, peakv, fperbin, loud);
    for (i = 0; i < peakcount; i++)
    {
        peakv[i].p_pit = sigmund_ftom(peakv[i].p_freq);
        peakv[i].p_db = sigmund_powtodb(peakv[i].p_amp);
    }
    *nfound = peakcount;
    BUF_FREEA(bigbuf, bufsize);
}